

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_still_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int __val;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  float fVar3;
  int i;
  Mat image;
  int height;
  int width;
  Mat *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char **in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  int iVar4;
  string *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  _InputArray local_158;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  undefined4 local_e0;
  int local_dc;
  Mat local_d8 [103];
  allocator<char> local_71;
  string local_70 [32];
  int local_50;
  allocator<char> local_39;
  string local_38 [36];
  int local_14;
  int local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_4 = 0;
  usage();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  fVar3 = getParamVal(in_stack_fffffffffffffe38,iVar4,in_stack_fffffffffffffe28,
                      (float)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  __val = (int)fVar3;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = __val;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  fVar3 = getParamVal(in_stack_fffffffffffffe38,iVar4,in_stack_fffffffffffffe28,
                      (float)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  poVar5 = (ostream *)&std::cout;
  local_50 = (int)fVar3;
  poVar2 = std::operator<<((ostream *)&std::cout,"Initializing ...");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2,"x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar4 = 0x107188;
  raspicam::RaspiCam_Still_Cv::set(0x107188,(double)local_14);
  raspicam::RaspiCam_Still_Cv::set(iVar4,(double)local_50);
  raspicam::RaspiCam_Still_Cv::open();
  cv::Mat::Mat(local_d8);
  poVar2 = std::operator<<(poVar5,"capturing");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_dc = 0;
  do {
    if (4 < local_dc) {
      local_4 = 0;
LAB_00103a72:
      local_e0 = 1;
      cv::Mat::~Mat(local_d8);
      return local_4;
    }
    bVar1 = raspicam::RaspiCam_Still_Cv::grab();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error in grab");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_4 = -1;
      goto LAB_00103a72;
    }
    raspicam::RaspiCam_Still_Cv::retrieve((Mat *)Camera);
    poVar2 = std::operator<<((ostream *)&std::cout,"saving picture");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_dc);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::operator<<(poVar2,".jpg");
    std::ostream::operator<<((ostream *)__lhs,std::endl<char,std::char_traits<char>>);
    std::__cxx11::to_string(__val);
    std::operator+((char *)__lhs,in_stack_fffffffffffffe20);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffe20);
    cv::_InputArray::_InputArray((_InputArray *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    local_178._M_dataplus = (_Alloc_hider)0x0;
    local_178._1_7_ = 0;
    local_178._M_string_length = 0;
    local_178.field_2._M_allocated_capacity = 0;
    in_stack_fffffffffffffe20 = &local_178;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x103956);
    cv::imwrite(local_100,&local_158,(vector *)in_stack_fffffffffffffe20);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar2);
    cv::_InputArray::~_InputArray(&local_158);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );//define width
    int height =getParamVal ( "-h",argc,argv,1944 );//define height
    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.set ( CV_CAP_PROP_FRAME_WIDTH, width );
    Camera.set ( CV_CAP_PROP_FRAME_HEIGHT, height );
    Camera.open();
    cv::Mat image;
    cout<<"capturing"<<endl;
    for(int i=0;i<5;i++){
        if ( !Camera.grab ( ) ) {
            cerr<<"Error in grab"<<endl;
            return -1;
        }
        Camera.retrieve ( image );
        cout<<"saving picture"<<i<<".jpg"<<endl;
        cv::imwrite ( "picture-"+std::to_string(i)+".jpg",image );
    }
    return 0;
}